

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeArrayIndex(ExpressionContext *ctx,SynTypeArray *syntax)

{
  IntrusiveList<SynCallArgument> arguments_00;
  bool bVar1;
  SynCallArgument *this;
  SynArrayIndex *this_00;
  ExprBase *pEVar2;
  SynBase *local_70;
  undefined1 local_38 [8];
  IntrusiveList<SynCallArgument> arguments;
  SynBase *el;
  SynArrayIndex *value;
  SynTypeArray *syntax_local;
  ExpressionContext *ctx_local;
  
  if ((syntax->sizes).head != (SynBase *)0x0) {
    el = (SynBase *)0x0;
    arguments.tail = (SynCallArgument *)(syntax->sizes).head;
    while (arguments.tail != (SynCallArgument *)0x0) {
      IntrusiveList<SynCallArgument>::IntrusiveList((IntrusiveList<SynCallArgument> *)local_38);
      bVar1 = isType<SynNothing>(&(arguments.tail)->super_SynBase);
      if (!bVar1) {
        this = ExpressionContext::get<SynCallArgument>(ctx);
        SynCallArgument::SynCallArgument
                  (this,((arguments.tail)->super_SynBase).begin,
                   ((arguments.tail)->super_SynBase).end,(SynIdentifier *)0x0,
                   &(arguments.tail)->super_SynBase);
        IntrusiveList<SynCallArgument>::push_back((IntrusiveList<SynCallArgument> *)local_38,this);
      }
      this_00 = ExpressionContext::get<SynArrayIndex>(ctx);
      if (el == (SynBase *)0x0) {
        local_70 = syntax->type;
      }
      else {
        local_70 = el;
      }
      arguments_00.tail = arguments.head;
      arguments_00.head = (SynCallArgument *)local_38;
      SynArrayIndex::SynArrayIndex
                (this_00,((arguments.tail)->super_SynBase).begin,
                 ((arguments.tail)->super_SynBase).end,local_70,arguments_00);
      arguments.tail = (SynCallArgument *)((arguments.tail)->super_SynBase).next;
      el = &this_00->super_SynBase;
    }
    pEVar2 = AnalyzeArrayIndex(ctx,(SynArrayIndex *)el);
    return pEVar2;
  }
  __assert_fail("syntax->sizes.head",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x159b,"ExprBase *AnalyzeArrayIndex(ExpressionContext &, SynTypeArray *)");
}

Assistant:

ExprBase* AnalyzeArrayIndex(ExpressionContext &ctx, SynTypeArray *syntax)
{
	assert(syntax->sizes.head);

	SynArrayIndex *value = NULL;

	// Convert to a chain of SynArrayIndex
	for(SynBase *el = syntax->sizes.head; el; el = el->next)
	{
		IntrusiveList<SynCallArgument> arguments;

		if(!isType<SynNothing>(el))
			arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(el->begin, el->end, NULL, el));

		value = new (ctx.get<SynArrayIndex>()) SynArrayIndex(el->begin, el->end, value ? value : syntax->type, arguments);
	}

	return AnalyzeArrayIndex(ctx, value);
}